

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 VmHttpSplitEncodedQuery(jx9_vm *pVm,SyString *pQuery,SyBlob *pWorker,int is_post)

{
  byte *zSrc;
  byte bVar1;
  char *zKey;
  byte *pbVar2;
  long lVar3;
  uint uVar4;
  jx9_value *pjVar5;
  jx9_value *pjVar6;
  ushort **ppuVar7;
  sxu32 nByte;
  byte *pbVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  int bUTF8;
  ulong in_R8;
  byte *pbVar13;
  bool bVar14;
  jx9_value *pjVar8;
  
  pbVar9 = (byte *)pQuery->zString;
  uVar4 = pQuery->nByte;
  if (is_post == 0) {
    pcVar10 = "_GET";
    nByte = 4;
  }
  else {
    pcVar10 = "_POST";
    nByte = 5;
  }
  pjVar5 = VmExtractSuper(pVm,pcVar10,nByte);
  pjVar6 = VmExtractSuper(pVm,"_REQUEST",8);
  bVar14 = (ulong)uVar4 != 0;
  pjVar8 = pjVar6;
  if (bVar14) {
    pbVar13 = pbVar9 + uVar4;
    ppuVar7 = __ctype_b_loc();
    do {
      bUTF8 = (int)in_R8;
      pjVar8 = (jx9_value *)*ppuVar7;
      bVar1 = *(byte *)((long)&pjVar8->x + (long)(char)*pbVar9 * 2 + 1);
      while ((bVar1 & 0x20) != 0) {
        pbVar9 = pbVar9 + 1;
        bVar14 = pbVar9 < pbVar13;
        if (!bVar14) goto LAB_00122e08;
        bVar1 = *(byte *)((long)&pjVar8->x + (long)(char)*pbVar9 * 2 + 1);
      }
      pbVar2 = pbVar9;
      if (!bVar14) break;
      while ((pbVar2 < pbVar13 &&
             ((0x3d < (ulong)*pbVar2 || ((0x2800004000000000U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0))
             ))) {
        pbVar2 = pbVar2 + 1;
      }
      pWorker->nByte = 0;
      if ((pWorker->nFlags & 4) != 0) {
        pWorker->pBlob = (void *)0x0;
        pWorker->mByte = 0;
        pWorker->nFlags = pWorker->nFlags & 0xfffffffb;
      }
      SyUriDecode((char *)pbVar9,(int)pbVar2 - (int)pbVar9,jx9VmBlobConsumer,pWorker,bUTF8);
      uVar4 = pWorker->nByte;
      pbVar9 = pbVar2;
      if (pbVar2 < pbVar13) {
        if (*pbVar2 == 0x3d) {
          zSrc = pbVar2 + 1;
          uVar11 = 1;
          uVar12 = uVar11;
          pbVar9 = zSrc;
          if (zSrc < pbVar13) {
            do {
              uVar12 = uVar11;
              if ((pbVar2[uVar11] == 0x26) || (pbVar2[uVar11] == 0x3b)) break;
              lVar3 = uVar11 + 1;
              uVar11 = uVar11 + 1;
              uVar12 = (long)pbVar13 - (long)pbVar2;
            } while (pbVar2 + lVar3 < pbVar13);
            pbVar9 = pbVar2 + uVar11;
          }
          if (uVar12 < 2) {
            in_R8 = 0;
            pcVar10 = (char *)0x0;
          }
          else {
            SyUriDecode((char *)zSrc,(int)uVar12 - 1,jx9VmBlobConsumer,pWorker,bUTF8);
            pcVar10 = (char *)((long)pWorker->pBlob + (ulong)uVar4);
            in_R8 = (ulong)(pWorker->nByte - uVar4);
          }
        }
        else {
          in_R8 = 0;
          pcVar10 = (char *)0x0;
        }
      }
      else {
        in_R8 = 0;
        pcVar10 = (char *)0x0;
      }
      zKey = (char *)pWorker->pBlob;
      if ((pjVar5 != (jx9_value *)0x0) && ((pjVar5->iFlags & 0x40) != 0)) {
        VmHashmapInsert((jx9_hashmap *)(pjVar5->x).pOther,zKey,uVar4,pcVar10,(int)in_R8);
      }
      pjVar8 = pjVar6;
      if ((pjVar6 != (jx9_value *)0x0) && ((pjVar6->iFlags & 0x40) != 0)) {
        uVar4 = VmHashmapInsert((jx9_hashmap *)(pjVar6->x).pOther,zKey,uVar4,pcVar10,(int)in_R8);
        pjVar8 = (jx9_value *)(ulong)uVar4;
      }
      pbVar9 = pbVar9 + 1;
      bVar14 = pbVar9 < pbVar13;
    } while (bVar14);
  }
LAB_00122e08:
  return (sxi32)pjVar8;
}

Assistant:

static sxi32 VmHttpSplitEncodedQuery(
	 jx9_vm *pVm,       /* Target VM */
	 SyString *pQuery,  /* Raw query to decode */
	 SyBlob *pWorker,   /* Working buffer */
	 int is_post        /* TRUE if we are dealing with a POST request */
	 )
 {
	 const char *zEnd = &pQuery->zString[pQuery->nByte];
	 const char *zIn = pQuery->zString;
	 jx9_value *pGet, *pRequest;
	 SyString sName, sValue;
	 const char *zPtr;
	 sxu32 nBlobOfft;
	 /* Extract superglobals */
	 if( is_post ){
		 /* $_POST superglobal */
		 pGet = VmExtractSuper(&(*pVm), "_POST", sizeof("_POST")-1);
	 }else{
		 /* $_GET superglobal */
		 pGet = VmExtractSuper(&(*pVm), "_GET", sizeof("_GET")-1);
	 }
	 pRequest = VmExtractSuper(&(*pVm), "_REQUEST", sizeof("_REQUEST")-1);
	 /* Split up the raw query */
	 for(;;){
		 /* Jump leading white spaces */
		 while(zIn < zEnd  && SyisSpace(zIn[0]) ){
			 zIn++;
		 }
		 if( zIn >= zEnd ){
			 break;
		 }
		 zPtr = zIn;
		 while( zPtr < zEnd && zPtr[0] != '=' && zPtr[0] != '&' && zPtr[0] != ';' ){
			 zPtr++;
		 }
		 /* Reset the working buffer */
		 SyBlobReset(pWorker);
		 /* Decode the entry */
		 SyUriDecode(zIn, (sxu32)(zPtr-zIn), jx9VmBlobConsumer, pWorker, TRUE);
		 /* Save the entry */
		 sName.nByte = SyBlobLength(pWorker);
		 sValue.zString = 0;
		 sValue.nByte = 0;
		 if( zPtr < zEnd && zPtr[0] == '=' ){
			 zPtr++;
			 zIn = zPtr;
			 /* Store field value */
			 while( zPtr < zEnd && zPtr[0] != '&' && zPtr[0] != ';' ){
				 zPtr++;
			 }
			 if( zPtr > zIn ){
				 /* Decode the value */
				  nBlobOfft = SyBlobLength(pWorker);
				  SyUriDecode(zIn, (sxu32)(zPtr-zIn), jx9VmBlobConsumer, pWorker, TRUE);
				  sValue.zString = (const char *)SyBlobDataAt(pWorker, nBlobOfft);
				  sValue.nByte = SyBlobLength(pWorker) - nBlobOfft;
				 
			 }
			 /* Synchronize pointers */
			 zIn = zPtr;
		 }
		 sName.zString = (const char *)SyBlobData(pWorker);
		 /* Install the decoded query in the $_GET/$_REQUEST array */
		 if( pGet && (pGet->iFlags & MEMOBJ_HASHMAP) ){
			 VmHashmapInsert((jx9_hashmap *)pGet->x.pOther, 
				 sName.zString, (int)sName.nByte, 
				 sValue.zString, (int)sValue.nByte
				 );
		 }
		 if( pRequest && (pRequest->iFlags & MEMOBJ_HASHMAP) ){
			 VmHashmapInsert((jx9_hashmap *)pRequest->x.pOther, 
				 sName.zString, (int)sName.nByte, 
				 sValue.zString, (int)sValue.nByte
					 );
		 }
		 /* Advance the pointer */
		 zIn = &zPtr[1];
	 }
	/* All done*/
	return SXRET_OK;
 }